

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall gl4cts::anon_unknown_0::BasicSyntaxSSO::RunIteration(BasicSyntaxSSO *this,char *vs)

{
  char *__s;
  bool bVar1;
  GLuint GVar2;
  int w;
  int h;
  Vector<float,_3> local_60 [2];
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *vs_local;
  BasicSyntaxSSO *this_local;
  
  local_20 = vs;
  vs_local = (char *)this;
  if (this->m_vsp != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vsp);
  }
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  GVar2 = ShaderStorageBufferObjectBase::BuildShaderProgram
                    (&this->super_ShaderStorageBufferObjectBase,0x8b31,&local_40);
  this->m_vsp = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_vsp);
  if (bVar1) {
    glu::CallLogWrapper::glClear
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_pipeline,1,this->m_vsp);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,0,3);
    w = ShaderStorageBufferObjectBase::getWindowWidth(&this->super_ShaderStorageBufferObjectBase);
    h = ShaderStorageBufferObjectBase::getWindowHeight(&this->super_ShaderStorageBufferObjectBase);
    tcu::Vector<float,_3>::Vector(local_60,0.0,1.0,0.0);
    this_local._7_1_ =
         ShaderStorageBufferObjectBase::ValidateReadBuffer
                   (&this->super_ShaderStorageBufferObjectBase,0,0,w,h,local_60);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RunIteration(const char* vs)
	{
		if (m_vsp != 0)
			glDeleteProgram(m_vsp);
		m_vsp = BuildShaderProgram(GL_VERTEX_SHADER, vs);
		if (!CheckProgram(m_vsp))
			return false;

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glDrawArrays(GL_TRIANGLES, 0, 3);

		return ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0));
	}